

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_mov_reg_v(DisasContext *s,MemOp ot,int reg,TCGv_i64 t0)

{
  TCGContext *tcg_ctx_00;
  _Bool _Var1;
  TCGContext *tcg_ctx;
  TCGv_i64 t0_local;
  int reg_local;
  MemOp ot_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  switch(ot) {
  case MO_8:
    _Var1 = byte_reg_is_xH(s,reg);
    if (_Var1) {
      tcg_gen_deposit_i64_x86_64
                (tcg_ctx_00,tcg_ctx_00->cpu_regs[reg + -4],tcg_ctx_00->cpu_regs[reg + -4],t0,8,8);
    }
    else {
      tcg_gen_deposit_i64_x86_64
                (tcg_ctx_00,tcg_ctx_00->cpu_regs[reg],tcg_ctx_00->cpu_regs[reg],t0,0,8);
    }
    break;
  case MO_16:
    tcg_gen_deposit_i64_x86_64
              (tcg_ctx_00,tcg_ctx_00->cpu_regs[reg],tcg_ctx_00->cpu_regs[reg],t0,0,0x10);
    break;
  case MO_32:
    tcg_gen_ext32u_i64_x86_64(tcg_ctx_00,tcg_ctx_00->cpu_regs[reg],t0);
    break;
  case MO_64:
    tcg_gen_mov_i64_x86_64(tcg_ctx_00,tcg_ctx_00->cpu_regs[reg],t0);
    break;
  default:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/translate.c"
            ,0x1e7);
    abort();
  }
  return;
}

Assistant:

static void gen_op_mov_reg_v(DisasContext *s, MemOp ot, int reg, TCGv t0)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    switch(ot) {
    case MO_8:
        if (!byte_reg_is_xH(s, reg)) {
            tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], tcg_ctx->cpu_regs[reg], t0, 0, 8);
        } else {
            tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_regs[reg - 4], tcg_ctx->cpu_regs[reg - 4], t0, 8, 8);
        }
        break;
    case MO_16:
        tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], tcg_ctx->cpu_regs[reg], t0, 0, 16);
        break;
    case MO_32:
        /* For x86_64, this sets the higher half of register to zero.
           For i386, this is equivalent to a mov. */
        tcg_gen_ext32u_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], t0);
        break;
#ifdef TARGET_X86_64
    case MO_64:
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], t0);
        break;
#endif
    default:
        tcg_abort();
    }
}